

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void Map_Remove(Map *tree,void *str,size_t size)

{
  void *pvVar1;
  bool bVar2;
  byte local_39;
  ulong uStack_38;
  char what_to_null;
  size_t where;
  Stack stk;
  size_t size_local;
  void *str_local;
  Map *tree_local;
  
  stk.size = size;
  Stack_Init((Stack *)&where);
  local_39 = *str;
  Stack_Push((Stack *)&where,tree);
  uStack_38 = 0;
  str_local = tree;
  while( true ) {
    bVar2 = false;
    if (uStack_38 < stk.size - 1) {
      bVar2 = *(long *)((long)str_local + (ulong)*(byte *)((long)str + uStack_38) * 8 + 8) != 0;
    }
    if (!bVar2) break;
    str_local = *(void **)((long)str_local + (ulong)*(byte *)((long)str + uStack_38) * 8 + 8);
    if (*str_local == '\x01') {
      while (stk.first != (Stack_Node *)0x0) {
        Stack_Pop((Stack *)&where);
      }
      local_39 = *(byte *)((long)str + uStack_38 + 1);
    }
    Stack_Push((Stack *)&where,str_local);
    uStack_38 = uStack_38 + 1;
  }
  if (*(long *)((long)str_local + (ulong)*(byte *)((long)str + uStack_38) * 8 + 8) != 0) {
    free(*(void **)((long)str_local + (ulong)*(byte *)((long)str + uStack_38) * 8 + 8));
    while ((Stack_Node *)0x1 < stk.first) {
      pvVar1 = Stack_Pop((Stack *)&where);
      free(pvVar1);
    }
    pvVar1 = Stack_Pop((Stack *)&where);
    *(undefined8 *)((long)pvVar1 + (ulong)local_39 * 8 + 8) = 0;
  }
  return;
}

Assistant:

void Map_Remove(Map *tree, void *str,size_t size)
{
	Stack stk;
	Stack_Init(&stk);
	size_t where;
	char what_to_null=((char*)str)[0];

	Stack_Push(&stk,tree);

	for(where=0;where<size-1 && tree->delta[((unsigned char*)str)[where]]!=NULL;++where)
	{
		tree = tree->delta[((unsigned char*)str)[where]];
		if(tree->is_final==1)
		{
			while(stk.size>0)Stack_Pop(&stk);
			what_to_null=((char*)str)[where+1];
		}
		Stack_Push(&stk,tree);
	}
	if(tree->delta[((unsigned char*)str)[where]] == NULL)return;
	free(tree->delta[((unsigned char*)str)[where]]);
	while(stk.size>1)free(Stack_Pop(&stk));
	tree=(Map*)Stack_Pop(&stk);
	tree->delta[(unsigned char)what_to_null]=NULL;
	
}